

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_traits.hpp
# Opt level: O0

type jsoncons::unicode_traits::detect_encoding_from_bom<char>(char *data,size_t length)

{
  int iVar1;
  ulong in_RSI;
  int *in_RDI;
  type tVar2;
  uint8_t bom_utf32be [4];
  uint8_t bom_utf32le [4];
  uint8_t bom_utf16be [2];
  uint8_t bom_utf16le [2];
  uint8_t bom_utf8 [3];
  undefined2 local_23;
  undefined1 local_21;
  int *local_18;
  int *local_10;
  undefined4 local_8;
  
  local_23 = 0xbbef;
  local_21 = 0xbf;
  if ((in_RSI < 4) || (*in_RDI != 0xfeff)) {
    if ((in_RSI < 4) || (*in_RDI != -0x20000)) {
      if ((in_RSI < 2) || ((short)*in_RDI != -0x101)) {
        if ((in_RSI < 2) || ((short)*in_RDI != -2)) {
          local_18 = in_RDI;
          if (2 < in_RSI) {
            iVar1 = memcmp(in_RDI,&local_23,3);
            if (iVar1 == 0) {
              local_10 = (int *)((long)local_18 + 3);
              local_8 = 1;
              goto LAB_001bd2b6;
            }
          }
          local_10 = local_18;
          local_8 = 0;
        }
        else {
          local_10 = (int *)((long)in_RDI + 2);
          local_8 = 3;
        }
      }
      else {
        local_10 = (int *)((long)in_RDI + 2);
        local_8 = 2;
      }
    }
    else {
      local_10 = in_RDI + 1;
      local_8 = 5;
    }
  }
  else {
    local_10 = in_RDI + 1;
    local_8 = 4;
  }
LAB_001bd2b6:
  tVar2.encoding = local_8;
  tVar2.ptr = (char *)local_10;
  tVar2._12_4_ = 0;
  return tVar2;
}

Assistant:

typename std::enable_if<ext_traits::is_char8<CharT>::value,detect_encoding_result<CharT>>::type
    detect_encoding_from_bom(const CharT* data, std::size_t length)
    {
        const uint8_t bom_utf8[] = {0xef,0xbb,0xbf}; 
        const uint8_t bom_utf16le[] = {0xff,0xfe}; 
        const uint8_t bom_utf16be[] = {0xfe,0xff}; 
        const uint8_t bom_utf32le[] = {0xff,0xfe,0x00,0x00}; 
        const uint8_t bom_utf32be[] = {0x00,0x00,0xfe,0xff}; 

        if (length >= 4 && !memcmp(data,bom_utf32le,4))
        {
            return detect_encoding_result<CharT>{data+4,encoding_kind::utf32le};
        }
        else if (length >= 4 && !memcmp(data,bom_utf32be,4))
        {
            return detect_encoding_result<CharT>{data+4,encoding_kind::utf32be};
        }
        else if (length >= 2 && !memcmp(data,bom_utf16le,2))
        {
            return detect_encoding_result<CharT>{data+2,encoding_kind::utf16le};
        }
        else if (length >= 2 && !memcmp(data,bom_utf16be,2))
        {
            return detect_encoding_result<CharT>{data+2,encoding_kind::utf16be};
        }
        else if (length >= 3 && !memcmp(data,bom_utf8,3))
        {
            return detect_encoding_result<CharT>{data+3,encoding_kind::utf8};
        }
        else
        {
            return detect_encoding_result<CharT>{data,encoding_kind::undetected};
        }
    }